

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O3

bool __thiscall
Remapper::remap_stage_output(Remapper *this,D3DStageIO *d3d_output,VulkanStageIO *vk_output)

{
  dxil_spv_bool dVar1;
  bool bVar2;
  dxil_spv_d3d_shader_stage_io c_output;
  dxil_spv_vulkan_shader_stage_io local_38;
  dxil_spv_d3d_shader_stage_io local_28;
  
  local_28.semantic = d3d_output->semantic;
  local_28.semantic_index = d3d_output->semantic_index;
  local_28.start_row = 0;
  local_28.rows = 0;
  local_38.location = vk_output->location;
  local_38.component = vk_output->component;
  local_38.flags = vk_output->flags;
  bVar2 = true;
  if (this->stage_output_remapper != (dxil_spv_shader_stage_io_remapper_cb)0x0) {
    dVar1 = (*this->stage_output_remapper)(this->stage_output_userdata,&local_28,&local_38);
    if (dVar1 == '\x01') {
      vk_output->location = local_38.location;
      vk_output->component = local_38.component;
      vk_output->flags = local_38.flags;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool remap_stage_output(const D3DStageIO &d3d_output, VulkanStageIO &vk_output) override
	{
		dxil_spv_d3d_shader_stage_io c_output = { d3d_output.semantic, d3d_output.semantic_index };
		dxil_spv_vulkan_shader_stage_io c_vk_output = { vk_output.location, vk_output.component, vk_output.flags };

		if (stage_output_remapper)
		{
			if (stage_output_remapper(stage_output_userdata, &c_output, &c_vk_output) == DXIL_SPV_TRUE)
			{
				vk_output.location = c_vk_output.location;
				vk_output.component = c_vk_output.component;
				vk_output.flags = c_vk_output.flags;
				return true;
			}
			else
				return false;
		}
		else
		{
			return true;
		}
	}